

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Allocations.cpp
# Opt level: O1

void Allocations::validateOverlap(void)

{
  _Rb_tree_color *p_Var1;
  _Base_ptr p_Var2;
  int64_t iVar3;
  _Base_ptr p_Var4;
  char *text;
  long lVar5;
  ulong uVar6;
  long lVar7;
  pair<const_Allocations::Key,_Allocations::Usage> it;
  long local_68;
  _Base_ptr p_Stack_60;
  long local_58;
  _Base_ptr p_Stack_50;
  _Base_ptr local_48;
  _Base_ptr p_Stack_40;
  ulong local_38;
  
  local_68 = -1;
  p_Stack_60 = (_Base_ptr)0xffffffffffffffff;
  if ((_Rb_tree_header *)allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left !=
      &allocations._M_t._M_impl.super__Rb_tree_header) {
    lVar7 = -1;
    lVar5 = 0;
    uVar6 = 0;
    p_Var4 = allocations._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    do {
      local_58 = *(long *)(p_Var4 + 1);
      p_Stack_50 = p_Var4[1]._M_parent;
      local_48 = p_Var4[1]._M_left;
      p_Stack_40 = p_Var4[1]._M_right;
      local_38 = *(ulong *)(p_Var4 + 2);
      if (local_58 == local_68) {
        if (((long)p_Stack_50 <= (long)p_Stack_60) || (lVar7 <= (long)p_Stack_50))
        goto LAB_001788ca;
        text = "Content of areas %08llX and %08llx overlap";
        if (((long)p_Stack_50 < (long)&p_Stack_60->_M_color + lVar5) ||
           (((char)local_38 == '\x01' &&
            (text = "Areas %08llX and %08llx overlap and both fill", (uVar6 & 1) != 0)))) {
          Logger::queueError<long,long>(Warning,text,(long *)&p_Stack_60,(long *)&p_Stack_50);
        }
        p_Var2 = p_Stack_50;
        if (lVar7 <= (long)&p_Stack_50->_M_color + (long)&local_48->_M_color) goto LAB_001788ca;
        p_Var1 = &p_Stack_40->_M_color;
        iVar3 = getSubAreaUsage(local_58,(int64_t)p_Stack_50);
        lVar5 = (long)p_Var2 + (long)p_Var1 + (iVar3 - (long)p_Stack_60);
      }
      else {
LAB_001788ca:
        p_Var2 = p_Stack_40;
        local_68 = local_58;
        p_Stack_60 = p_Stack_50;
        uVar6 = local_38 & 0xff;
        iVar3 = getSubAreaUsage(local_58,(int64_t)p_Stack_50);
        lVar5 = (long)&p_Var2->_M_color + iVar3;
        lVar7 = (long)&p_Stack_50->_M_color + (long)&local_48->_M_color;
      }
      p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
    } while ((_Rb_tree_header *)p_Var4 != &allocations._M_t._M_impl.super__Rb_tree_header);
  }
  return;
}

Assistant:

void Allocations::validateOverlap()
{
	// An easy mistake to make is a "subarea" where the parent area fills, and erases the subarea.
	// Let's detect any sort of area overlap and report a warning.
	Key lastKey{ -1, -1 };
	int64_t lastEndPosition = -1;
	Usage lastUsage{};

	for (auto it : allocations) {
		if (it.first.fileID == lastKey.fileID && it.first.position > lastKey.position && it.first.position < lastEndPosition) {
			// First, the obvious: does the content overlap?
			if (it.first.position < lastKey.position + lastUsage.usage)
				Logger::queueError(Logger::Warning, "Content of areas %08llX and %08llx overlap", lastKey.position, it.first.position);
			// Next question, does the earlier one fill?
			else if (it.second.usesFill && lastUsage.usesFill)
				Logger::queueError(Logger::Warning, "Areas %08llX and %08llx overlap and both fill", lastKey.position, it.first.position);

			// If the new area ends before the last, keep it as the last.
			if (lastEndPosition > it.first.position + it.second.space) {
				// But update the usage to the max position.
				int64_t newUsageEnd = it.first.position + it.second.usage + getSubAreaUsage(it.first);
				lastUsage.usage = newUsageEnd - lastKey.position;
				continue;
			}
		}

		lastKey = it.first;
		lastUsage = it.second;
		lastUsage.usage += getSubAreaUsage(lastKey);
		lastEndPosition = it.first.position + it.second.space;
	}
}